

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::dumpHSharedObject(QPDF *this)

{
  int i;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  long lVar3;
  Pipeline *pPVar4;
  ulong uVar5;
  long lVar6;
  ulong i_00;
  QPDFLogger local_40;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFLogger::getInfo(&local_40,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
  pPVar4 = Pipeline::operator<<
                     ((Pipeline *)
                      local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"first_shared_obj: ");
  pPVar4 = Pipeline::operator<<(pPVar4,((_Var1._M_head_impl)->shared_object_hints).first_shared_obj)
  ;
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"first_shared_offset: ");
  lVar6 = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x30) <= lVar6) {
    lVar6 = lVar6 + *(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x38);
  }
  pPVar4 = Pipeline::operator<<(pPVar4,lVar6);
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nshared_first_page: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nshared_total: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_nobjects: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_group_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_group_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20));
  Pipeline::operator<<(pPVar4,"\n");
  if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lVar6 = 8;
  i_00 = 0;
  while( true ) {
    i = *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14);
    if (i < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
    }
    if ((ulong)(long)*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14) <= i_00)
    break;
    lVar3 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                        *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28))->
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
    ;
    uVar5 = ((long)*(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) - lVar3 >>
            2) * -0x5555555555555555;
    if (uVar5 < i_00 || uVar5 - i_00 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i_00);
    }
    QPDFLogger::getInfo(&local_40,
                        SUB81(*(undefined8 *)
                               &((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0
                             ));
    pPVar4 = Pipeline::operator<<
                       ((Pipeline *)
                        local_40.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        "Shared Object ");
    pPVar4 = Pipeline::operator<<(pPVar4,i_00);
    pPVar4 = Pipeline::operator<<(pPVar4,":\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  group length: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c) +
                               *(int *)(lVar3 + -8 + lVar6));
    Pipeline::operator<<(pPVar4,"\n");
    if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (*(int *)(lVar3 + -4 + lVar6) != 0) {
      QPDFLogger::getInfo(&local_40,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      Pipeline::operator<<
                ((Pipeline *)
                 local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,"  signature present\n");
      if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (*(int *)(lVar3 + lVar6) != 0) {
      QPDFLogger::getInfo(&local_40,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_40.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"  nobjects: ");
      pPVar4 = Pipeline::operator<<(pPVar4,*(int *)(lVar3 + lVar6) + 1);
      Pipeline::operator<<(pPVar4,"\n");
      if (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    i_00 = i_00 + 1;
    lVar6 = lVar6 + 0xc;
  }
  return;
}

Assistant:

void
QPDF::dumpHSharedObject()
{
    HSharedObject& t = m->shared_object_hints;
    *m->log->getInfo() << "first_shared_obj: " << t.first_shared_obj << "\n"
                       << "first_shared_offset: " << adjusted_offset(t.first_shared_offset) << "\n"
                       << "nshared_first_page: " << t.nshared_first_page << "\n"
                       << "nshared_total: " << t.nshared_total << "\n"
                       << "nbits_nobjects: " << t.nbits_nobjects << "\n"
                       << "min_group_length: " << t.min_group_length << "\n"
                       << "nbits_delta_group_length: " << t.nbits_delta_group_length << "\n";

    for (size_t i = 0; i < toS(t.nshared_total); ++i) {
        HSharedObjectEntry& se = t.entries.at(i);
        *m->log->getInfo() << "Shared Object " << i << ":\n"
                           << "  group length: " << se.delta_group_length + t.min_group_length
                           << "\n";
        // PDF spec says signature present nobjects_minus_one are always 0, so print them only if
        // they have a non-zero value.
        if (se.signature_present) {
            *m->log->getInfo() << "  signature present\n";
        }
        if (se.nobjects_minus_one != 0) {
            *m->log->getInfo() << "  nobjects: " << se.nobjects_minus_one + 1 << "\n";
        }
    }
}